

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_list.cpp
# Opt level: O0

void __thiscall ImageList::drawRow(ImageList *this,QPainter *painter,QRect *rect,int row)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QPalette *pQVar7;
  QColor *pQVar8;
  ListModel<QImage> *pLVar9;
  QImage *image_00;
  ImageListPrivate *pIVar10;
  QScopedPointer<ImageListPrivate,_QScopedPointerDeleter<ImageListPrivate>_> *this_00;
  QPoint local_138;
  QRect local_130;
  undefined1 local_120 [8];
  QRect r;
  int y;
  int x;
  QImage *image;
  undefined8 uStack_f8;
  QColor border;
  QPointF local_b0;
  QPointF local_a0;
  QLinearGradient local_90 [8];
  QLinearGradient g;
  undefined1 auStack_38 [8];
  QColor background;
  int row_local;
  QRect *rect_local;
  QPainter *painter_local;
  ImageList *this_local;
  
  background._12_4_ = row;
  pQVar7 = (QPalette *)QWidget::palette();
  pQVar8 = QPalette::color(pQVar7,Button);
  auStack_38 = *(undefined1 (*) [8])pQVar8;
  background._0_8_ = *(undefined8 *)((long)&pQVar8->ct + 4);
  QPointF::QPointF(&local_a0,0.0,0.0);
  QPointF::QPointF(&local_b0,1.0,0.0);
  QLinearGradient::QLinearGradient(local_90,(QPointF *)&local_a0,(QPointF *)&local_b0);
  QGradient::setCoordinateMode((CoordinateMode)local_90);
  QGradient::setColorAt(0.0,(QColor *)local_90);
  QtMWidgets::lighterColor((QColor *)auStack_38,0x4b);
  QGradient::setColorAt(1.0,(QColor *)local_90);
  pQVar7 = (QPalette *)QWidget::palette();
  pQVar8 = QPalette::color(pQVar7,Dark);
  uStack_f8 = *(undefined8 *)pQVar8;
  border._0_8_ = *(undefined8 *)((long)&pQVar8->ct + 4);
  QPainter::setPen((QColor *)painter);
  QBrush::QBrush((QBrush *)&image,(QGradient *)local_90);
  QPainter::setBrush((QBrush *)painter);
  QBrush::~QBrush((QBrush *)&image);
  pLVar9 = QtMWidgets::AbstractListView<QImage>::model(&this->super_AbstractListView<QImage>);
  image_00 = (QImage *)
             (**(code **)(*(long *)&pLVar9->super_AbstractListModel + 0x60))
                       (pLVar9,background._12_4_);
  iVar2 = QRect::x(rect);
  iVar3 = QRect::width(rect);
  iVar4 = QImage::width();
  r.y2 = iVar2 + (iVar3 - iVar4) / 2;
  iVar4 = QRect::y(rect);
  iVar3 = r.y2;
  r.x2 = iVar4;
  iVar5 = QImage::width();
  pIVar10 = QScopedPointer<ImageListPrivate,_QScopedPointerDeleter<ImageListPrivate>_>::operator->
                      (&this->d);
  iVar2 = pIVar10->borderWidth;
  iVar6 = QImage::height();
  pIVar10 = QScopedPointer<ImageListPrivate,_QScopedPointerDeleter<ImageListPrivate>_>::operator->
                      (&this->d);
  QRect::QRect((QRect *)local_120,iVar3,iVar4,iVar5 + iVar2 * 2,iVar6 + pIVar10->borderWidth * 2);
  QPainter::drawRect(painter,(QRect *)local_120);
  this_00 = &this->d;
  pIVar10 = QScopedPointer<ImageListPrivate,_QScopedPointerDeleter<ImageListPrivate>_>::operator->
                      (this_00);
  iVar2 = pIVar10->borderWidth;
  pIVar10 = QScopedPointer<ImageListPrivate,_QScopedPointerDeleter<ImageListPrivate>_>::operator->
                      (this_00);
  iVar3 = pIVar10->borderWidth;
  pIVar10 = QScopedPointer<ImageListPrivate,_QScopedPointerDeleter<ImageListPrivate>_>::operator->
                      (this_00);
  iVar4 = pIVar10->borderWidth;
  pIVar10 = QScopedPointer<ImageListPrivate,_QScopedPointerDeleter<ImageListPrivate>_>::operator->
                      (this_00);
  local_130 = QRect::adjusted((QRect *)local_120,iVar2 + -1,iVar3 + -1,-iVar4,-pIVar10->borderWidth)
  ;
  QPainter::drawRect(painter,&local_130);
  bVar1 = QImage::isNull();
  iVar2 = r.y2;
  if ((bVar1 & 1) == 0) {
    pIVar10 = QScopedPointer<ImageListPrivate,_QScopedPointerDeleter<ImageListPrivate>_>::operator->
                        (&this->d);
    iVar4 = r.x2;
    iVar3 = pIVar10->borderWidth;
    pIVar10 = QScopedPointer<ImageListPrivate,_QScopedPointerDeleter<ImageListPrivate>_>::operator->
                        (&this->d);
    QPoint::QPoint(&local_138,iVar2 + iVar3,iVar4 + pIVar10->borderWidth);
    QPainter::drawImage(painter,&local_138,image_00);
  }
  QLinearGradient::~QLinearGradient(local_90);
  return;
}

Assistant:

void
ImageList::drawRow( QPainter * painter,
	const QRect & rect, int row )
{
	QColor background = palette().color( QPalette::Button );

	QLinearGradient g( QPointF( 0.0, 0.0 ), QPointF( 1.0, 0.0 ) );
	g.setCoordinateMode( QGradient::ObjectBoundingMode );
	g.setColorAt( 0.0, background );
	g.setColorAt( 1.0, QtMWidgets::lighterColor( background, 75 ) );

	QColor border = palette().color( QPalette::Dark );

	painter->setPen( border );
	painter->setBrush( g );

	const QImage & image = model()->data( row );

	const int x = rect.x() + ( rect.width() - image.width() ) / 2;
	const int y = rect.y();

	const QRect r( x, y,
		image.width() + 2 * d->borderWidth,
		image.height() + 2 * d->borderWidth );

	painter->drawRect( r );
	painter->drawRect( r.adjusted( d->borderWidth - 1, d->borderWidth - 1,
		- d->borderWidth, - d->borderWidth ) );

	if( !image.isNull() )
		painter->drawImage( QPoint( x + d->borderWidth, y + d->borderWidth ),
			image );
}